

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void do_proficiencies(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  char *in_RSI;
  char_data *in_RDI;
  __type_conflict2 _Var4;
  char_data *in_stack_00000010;
  char_data *in_stack_00000018;
  CProficiencies *in_stack_00000020;
  int i;
  CHAR_DATA *iterator;
  bool bBreak;
  CHAR_DATA *trainer;
  char_data *in_stack_000000c0;
  CProficiencies *in_stack_000000c8;
  char_data *in_stack_000011e8;
  CProficiencies *in_stack_000011f0;
  char *in_stack_000013d0;
  char_data *in_stack_000013d8;
  char_data *in_stack_000013e0;
  CProficiencies *in_stack_000013e8;
  int local_2c;
  CHAR_DATA *local_28;
  CHAR_DATA *local_18;
  
  local_18 = (CHAR_DATA *)0x0;
  bVar2 = 0;
  uVar1 = in_RDI->act[0];
  _Var4 = std::pow<int,int>(0,0x7ac9e9);
  if ((uVar1 & (long)_Var4) == 0) {
    local_28 = in_RDI->in_room->people;
    while( true ) {
      bVar3 = false;
      if (local_28 != (CHAR_DATA *)0x0) {
        bVar3 = (bool)(bVar2 ^ 1);
      }
      if (!bVar3) break;
      uVar1 = local_28->act[0];
      _Var4 = std::pow<int,int>(0,0x7aca58);
      if ((uVar1 & (long)_Var4) != 0) {
        local_2c = 0;
        while( true ) {
          bVar3 = false;
          if (local_2c < 4) {
            bVar3 = (bool)(bVar2 ^ 1);
          }
          if (!bVar3) goto LAB_007acad3;
          if (-1 < local_28->pIndexData->profs_taught[local_2c]) break;
          local_2c = local_2c + 1;
        }
        bVar2 = 1;
        local_18 = local_28;
      }
LAB_007acad3:
      local_28 = local_28->next_in_room;
    }
    if ((local_18 == (CHAR_DATA *)0x0) && (bVar3 = str_cmp(in_RSI,"basic"), bVar3)) {
      char_data::Profs(in_RDI);
      CProficiencies::ListKnownProficiencies(in_stack_000000c8,in_stack_000000c0);
    }
    else {
      bVar3 = str_cmp(in_RSI,"basic");
      if (bVar3) {
        if (local_18 != (CHAR_DATA *)0x0) {
          if (*in_RSI == '\0') {
            char_data::Profs(in_RDI);
            CProficiencies::GetProfsTaughtByTrainer
                      (in_stack_00000020,in_stack_00000018,in_stack_00000010);
          }
          else {
            char_data::Profs(in_RDI);
            CProficiencies::TrainProficiency
                      (in_stack_000013e8,in_stack_000013e0,in_stack_000013d8,in_stack_000013d0);
          }
        }
      }
      else {
        char_data::Profs(in_RDI);
        CProficiencies::ListBasicProficiencies(in_stack_000011f0,in_stack_000011e8);
      }
    }
  }
  return;
}

Assistant:

void do_proficiencies(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *trainer = nullptr;
	bool bBreak= false;

	if (IS_NPC(ch))
		return;

	for (auto iterator = ch->in_room->people; iterator && !bBreak; iterator = iterator->next_in_room)
	{
		if (!IS_NPC(iterator))
			continue;

		for (int i = 0; i < MAX_PROFS_TAUGHT_BY_MOB && !bBreak; i++)
		{
			if (iterator->pIndexData->profs_taught[i] > -1)
			{
				bBreak = true;
				trainer = iterator;
				break;
			}
		}
	}

	if (!trainer && str_cmp(argument, "basic"))
	{
		ch->Profs()->ListKnownProficiencies(ch);
		return;
	}
	else if (!str_cmp(argument, "basic"))
	{
		ch->Profs()->ListBasicProficiencies(ch);
		return;
	}

	if (!trainer)
		return;

	if (argument[0] != '\0')
	{
		ch->Profs()->TrainProficiency(ch, trainer, argument);
		return;
	}

	ch->Profs()->GetProfsTaughtByTrainer(ch, trainer);
}